

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

upb_StringView jsondec_string(jsondec *d)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  upb_StringView uVar4;
  char cVar5;
  size_t sVar6;
  char *pcStack_38;
  char ch;
  char *buf_end;
  char *end;
  char *buf;
  jsondec *d_local;
  upb_StringView ret;
  
  end = (char *)0x0;
  buf_end = (char *)0x0;
  pcStack_38 = (char *)0x0;
  buf = (char *)d;
  jsondec_skipws(d);
  pcVar2 = *(char **)buf;
  *(char **)buf = pcVar2 + 1;
  if (*pcVar2 != '\"') {
    jsondec_err((jsondec *)buf,"Expected string");
  }
  while (*(ulong *)buf < *(ulong *)(buf + 8)) {
    pbVar3 = *(byte **)buf;
    *(byte **)buf = pbVar3 + 1;
    bVar1 = *pbVar3;
    if (buf_end == pcStack_38) {
      jsondec_resize((jsondec *)buf,&end,&buf_end,&stack0xffffffffffffffc8);
    }
    if (bVar1 == 0x22) {
      *buf_end = '\0';
      uVar4.size = (long)buf_end - (long)end;
      uVar4.data = end;
      return uVar4;
    }
    if (bVar1 == 0x5c) {
      if (*(long *)buf == *(long *)(buf + 8)) break;
      if (**(char **)buf == 'u') {
        *(long *)buf = *(long *)buf + 1;
        if ((long)pcStack_38 - (long)buf_end < 4) {
          jsondec_resize((jsondec *)buf,&end,&buf_end,&stack0xffffffffffffffc8);
        }
        sVar6 = jsondec_unicode((jsondec *)buf,buf_end);
        buf_end = buf_end + sVar6;
      }
      else {
        cVar5 = jsondec_escape((jsondec *)buf);
        *buf_end = cVar5;
        buf_end = buf_end + 1;
      }
    }
    else {
      if (bVar1 < 0x20) {
        jsondec_err((jsondec *)buf,"Invalid char in JSON string");
      }
      *buf_end = bVar1;
      buf_end = buf_end + 1;
    }
  }
  jsondec_err((jsondec *)buf,"EOF inside string");
}

Assistant:

static upb_StringView jsondec_string(jsondec* d) {
  char* buf = NULL;
  char* end = NULL;
  char* buf_end = NULL;

  jsondec_skipws(d);

  if (*d->ptr++ != '"') {
    jsondec_err(d, "Expected string");
  }

  while (d->ptr < d->end) {
    char ch = *d->ptr++;

    if (end == buf_end) {
      jsondec_resize(d, &buf, &end, &buf_end);
    }

    switch (ch) {
      case '"': {
        upb_StringView ret;
        ret.data = buf;
        ret.size = end - buf;
        *end = '\0'; /* Needed for possible strtod(). */
        return ret;
      }
      case '\\':
        if (d->ptr == d->end) goto eof;
        if (*d->ptr == 'u') {
          d->ptr++;
          if (buf_end - end < 4) {
            /* Allow space for maximum-sized codepoint (4 bytes). */
            jsondec_resize(d, &buf, &end, &buf_end);
          }
          end += jsondec_unicode(d, end);
        } else {
          *end++ = jsondec_escape(d);
        }
        break;
      default:
        if ((unsigned char)ch < 0x20) {
          jsondec_err(d, "Invalid char in JSON string");
        }
        *end++ = ch;
        break;
    }
  }

eof:
  jsondec_err(d, "EOF inside string");
}